

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall SimpleLoggerMgr::addRawStackInfo(SimpleLoggerMgr *this,bool crash_origin)

{
  pointer *pppvVar1;
  pointer pRVar2;
  iterator __position;
  ushort uVar3;
  int iVar4;
  uint64_t uVar5;
  void **__args;
  long lVar6;
  id tid;
  void *stack_ptr [256];
  RawStackInfo local_858;
  void *local_828 [256];
  
  __args = local_828;
  iVar4 = backtrace(__args,0x100);
  local_858._0_8_ = (ulong)(uint)local_858._4_4_ << 0x20;
  local_858.kernelTid = 0;
  local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_858.crashOrigin = false;
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::
  emplace_back<SimpleLoggerMgr::RawStackInfo>(&this->crashDumpThreadStacks,&local_858);
  if (local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pRVar2 = (this->crashDumpThreadStacks).
           super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_858._0_8_ = pthread_self();
  uVar3 = std::_Hash_bytes(&local_858,8,0xc70f6907);
  pRVar2[-1].tidHash = (uint)uVar3;
  uVar5 = syscall(0xba);
  pRVar2[-1].kernelTid = uVar5;
  pRVar2[-1].crashOrigin = crash_origin;
  if (iVar4 != 0) {
    lVar6 = (long)iVar4;
    do {
      __position._M_current =
           pRVar2[-1].stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          pRVar2[-1].stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((vector<void*,std::allocator<void*>> *)&pRVar2[-1].stackPtrs,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        pppvVar1 = &pRVar2[-1].stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                    .super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      __args = __args + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::addRawStackInfo(bool crash_origin) {
#if defined(__linux__) || defined(__APPLE__)
    void* stack_ptr[256];
    size_t len = _stack_backtrace(stack_ptr, 256);

    crashDumpThreadStacks.push_back(RawStackInfo());
    RawStackInfo& stack_info = *(crashDumpThreadStacks.rbegin());
    std::thread::id tid = std::this_thread::get_id();
    stack_info.tidHash = std::hash<std::thread::id>{}(tid) % 0x10000;
#ifdef __linux__
    stack_info.kernelTid = (uint64_t)syscall(SYS_gettid);
#endif
    stack_info.crashOrigin = crash_origin;
    for (size_t ii=0; ii<len; ++ii) {
        stack_info.stackPtrs.push_back(stack_ptr[ii]);
    }
#endif
}